

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scrubbers.cpp
# Opt level: O1

string * ApprovalTests::Scrubbers::doNothing(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (input->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + input->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string doNothing(const std::string& input)
        {
            return input;
        }